

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_gen.cc
# Opt level: O3

int bitstr_cb(char *elem,size_t len,void *bitstr)

{
  int iVar1;
  uint uVar2;
  uint64_t bitnum;
  CBS cbs;
  ulong local_20;
  CBS local_18;
  
  local_18.data = (uint8_t *)elem;
  local_18.len = len;
  iVar1 = CBS_get_u64_decimal(&local_18,&local_20);
  if ((iVar1 == 0) || (0x100 < local_20 || local_18.len != 0)) {
    uVar2 = 0;
    ERR_put_error(0xc,0,0x91,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/asn1_gen.cc"
                  ,0x212);
  }
  else {
    iVar1 = ASN1_BIT_STRING_set_bit((ASN1_BIT_STRING *)bitstr,(int)local_20,1);
    uVar2 = (uint)(iVar1 != 0);
  }
  return uVar2;
}

Assistant:

static int bitstr_cb(const char *elem, size_t len, void *bitstr) {
  CBS cbs;
  CBS_init(&cbs, (const uint8_t *)elem, len);
  uint64_t bitnum;
  if (!CBS_get_u64_decimal(&cbs, &bitnum) || CBS_len(&cbs) != 0 ||
      // Cap the highest allowed bit so this mechanism cannot be used to create
      // extremely large allocations with short inputs. The highest named bit in
      // RFC 5280 is 8, so 256 should give comfortable margin but still only
      // allow a 32-byte allocation.
      //
      // We do not consider this function to be safe with untrusted inputs (even
      // without bugs, it is prone to string injection vulnerabilities), so DoS
      // is not truly a concern, but the limit is necessary to keep fuzzing
      // effective.
      bitnum > 256) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_INVALID_NUMBER);
    return 0;
  }
  if (!ASN1_BIT_STRING_set_bit(reinterpret_cast<ASN1_BIT_STRING *>(bitstr),
                               (int)bitnum, 1)) {
    return 0;
  }
  return 1;
}